

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetObjectLibrariesCMP0026
          (cmGeneratorTarget *this,
          vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *objlibs)

{
  pointer pbVar1;
  bool bVar2;
  size_type sVar3;
  pointer pbVar4;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var5;
  string_view str;
  cmBTStringRange cVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  cmGeneratorTarget *objLib;
  cmList files;
  string objLibName;
  
  cVar6 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
  while (local_88 = cVar6.End._M_current, _Var5 = cVar6.Begin._M_current,
        _Var5._M_current != local_88._M_current) {
    std::__cxx11::string::string((string *)&objLibName,(string *)_Var5._M_current);
    init._M_len = 1;
    init._M_array = &objLibName;
    cmList::cmList(&files,init);
    std::__cxx11::string::~string((string *)&objLibName);
    pbVar1 = files.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = files.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      str._M_str = (pbVar4->_M_dataplus)._M_p;
      str._M_len = pbVar4->_M_string_length;
      bVar2 = cmHasLiteralPrefix<18ul>(str,(char (*) [18])"$<TARGET_OBJECTS:");
      if ((bVar2) && ((pbVar4->_M_dataplus)._M_p[pbVar4->_M_string_length - 1] == '>')) {
        std::__cxx11::string::substr((ulong)&objLibName,(ulong)pbVar4);
        sVar3 = cmGeneratorExpression::Find(&objLibName);
        if (sVar3 == 0xffffffffffffffff) {
          objLib = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,&objLibName);
          if (objLib != (cmGeneratorTarget *)0x0) {
            std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                      (objlibs,&objLib);
          }
        }
        std::__cxx11::string::~string((string *)&objLibName);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files.Values);
    cVar6.End._M_current = local_88._M_current;
    cVar6.Begin._M_current = _Var5._M_current + 1;
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetObjectLibrariesCMP0026(
  std::vector<cmGeneratorTarget*>& objlibs) const
{
  // At configure-time, this method can be called as part of getting the
  // LOCATION property or to export() a file to be include()d.  However
  // there is no cmGeneratorTarget at configure-time, so search the SOURCES
  // for TARGET_OBJECTS instead for backwards compatibility with OLD
  // behavior of CMP0024 and CMP0026 only.
  cmBTStringRange rng = this->Target->GetSourceEntries();
  for (auto const& entry : rng) {
    cmList files{ entry.Value };
    for (auto const& li : files) {
      if (cmHasLiteralPrefix(li, "$<TARGET_OBJECTS:") && li.back() == '>') {
        std::string objLibName = li.substr(17, li.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          continue;
        }
        cmGeneratorTarget* objLib =
          this->LocalGenerator->FindGeneratorTargetToUse(objLibName);
        if (objLib) {
          objlibs.push_back(objLib);
        }
      }
    }
  }
}